

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O3

Req __thiscall
adios2::helper::CommImplDummy::Irecv
          (CommImplDummy *this,void *param_1,size_t param_2,Datatype param_3,int param_4,int param_5
          ,string *param_6)

{
  __uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
       operator_new(8);
  *(undefined ***)
   local_10._M_t.
   super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
   .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       &PTR__CommReqImplDummy_0086b490;
  CommImpl::MakeReq(&this->super_CommImpl,
                    (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
                     *)&local_10);
  if ((_Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
        .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl !=
      (CommReqImpl *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                          .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl
                + 8))();
  }
  return (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         )(unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
           )this;
}

Assistant:

Comm::Req CommImplDummy::Irecv(void *, size_t, Datatype, int, int, const std::string &) const
{
    auto req = std::unique_ptr<CommReqImplDummy>(new CommReqImplDummy());
    return MakeReq(std::move(req));
}